

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          uint32_t param_7,bool need_transpose)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((target_type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Access chains that result in an array can not be flattened","");
    ::std::runtime_error::runtime_error(this_00,(string *)local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_00357118;
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)&(target_type->super_IVariant).field_0xc == 0xf) {
    flattened_access_chain_struct_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset);
  }
  else if (target_type->columns < 2) {
    flattened_access_chain_vector_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset,matrix_stride,
               need_transpose);
  }
  else {
    flattened_access_chain_matrix_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset,matrix_stride,
               need_transpose);
  }
  return __return_storage_ptr__;
}

Assistant:

static bool packing_has_flexible_offset(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingStd140:
	case BufferPackingStd430:
	case BufferPackingScalar:
	case BufferPackingHLSLCbuffer:
		return false;

	default:
		return true;
	}
}